

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::ExternalCommand::configureAttribute
          (ExternalCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  bool bVar1;
  int iVar2;
  Twine *this_00;
  char *LHS;
  int *__s1;
  size_t sVar3;
  StringRef name_local;
  StringRef value_local;
  Twine local_c8;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  sVar3 = value.Length;
  __s1 = (int *)value.Data;
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  value_local.Data = (char *)__s1;
  value_local.Length = sVar3;
  if (name_local.Length == 0x12) {
    iVar2 = bcmp(name_local.Data,"always-out-of-date",0x12);
    if (iVar2 == 0) {
      if (sVar3 == 5) {
        iVar2 = bcmp(__s1,"false",5);
        if (iVar2 == 0) {
          bVar1 = false;
          goto LAB_0015e284;
        }
      }
      else if ((sVar3 == 4) && (*__s1 == 0x65757274)) {
        bVar1 = true;
LAB_0015e284:
        this->alwaysOutOfDate = bVar1;
        return true;
      }
      goto LAB_0015e1e8;
    }
LAB_0015e0de:
    LHS = "unexpected attribute: \'";
  }
  else {
    if (name_local.Length != 0x1d) {
      if (name_local.Length == 0x16) {
        iVar2 = bcmp(name_local.Data,"allow-modified-outputs",0x16);
        if (iVar2 != 0) goto LAB_0015e0de;
        if (sVar3 == 5) {
          iVar2 = bcmp(__s1,"false",5);
          if (iVar2 == 0) {
            bVar1 = false;
            goto LAB_0015e1c2;
          }
        }
        else if ((sVar3 == 4) && (*__s1 == 0x65757274)) {
          bVar1 = true;
LAB_0015e1c2:
          this->allowModifiedOutputs = bVar1;
          return true;
        }
      }
      else {
        if ((name_local.Length != 0x14) ||
           (iVar2 = bcmp(name_local.Data,"allow-missing-inputs",0x14), iVar2 != 0))
        goto LAB_0015e0de;
        if (sVar3 == 5) {
          iVar2 = bcmp(__s1,"false",5);
          if (iVar2 == 0) {
            bVar1 = false;
            goto LAB_0015e19e;
          }
        }
        else if ((sVar3 == 4) && (*__s1 == 0x65757274)) {
          bVar1 = true;
LAB_0015e19e:
          this->allowMissingInputs = bVar1;
          return true;
        }
      }
LAB_0015e1e8:
      llvm::Twine::Twine(&local_38,"invalid value: \'",&value_local);
      llvm::Twine::Twine(&local_50,"\' for attribute \'");
      llvm::Twine::concat(&local_c8,&local_38,&local_50);
      llvm::Twine::Twine(&local_68,&name_local);
      llvm::Twine::concat(&local_b0,&local_c8,&local_68);
      this_00 = &local_80;
      llvm::Twine::Twine(this_00,"\'");
      goto LAB_0015e117;
    }
    iVar2 = bcmp(name_local.Data,"repair-via-ownership-analysis",0x1d);
    if (iVar2 != 0) goto LAB_0015e0de;
    if (sVar3 == 5) {
      iVar2 = bcmp(__s1,"false",5);
      if (iVar2 == 0) {
        (this->super_Command).repairViaOwnershipAnalysis = false;
        return true;
      }
    }
    else if ((sVar3 == 4) && (*__s1 == 0x65757274)) {
      (this->super_Command).repairViaOwnershipAnalysis = true;
      return true;
    }
    LHS = "invalid value for attribute: \'";
  }
  llvm::Twine::Twine(&local_b0,LHS,&name_local);
  this_00 = &local_c8;
  llvm::Twine::Twine(this_00,"\'");
LAB_0015e117:
  llvm::Twine::concat(&local_98,&local_b0,this_00);
  ConfigureContext::error(ctx,&local_98);
  return false;
}

Assistant:

bool ExternalCommand::
configureAttribute(const ConfigureContext& ctx, StringRef name,
                   StringRef value) {
  if (name == "allow-missing-inputs") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    allowMissingInputs = value == "true";
    return true;
  } else if (name == "allow-modified-outputs") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    allowModifiedOutputs = value == "true";
    return true;
  } else if (name == "always-out-of-date") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    alwaysOutOfDate = value == "true";
    return true;
    
  } else if (name == "repair-via-ownership-analysis") {
    if (value == "true") {
      repairViaOwnershipAnalysis = true;
      return true;
    } else if (value == "false") {
      repairViaOwnershipAnalysis = false;
      return true;
    } else {
      ctx.error("invalid value for attribute: '" + name + "'");
      return false;
    }
  } else {
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }
}